

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O0

void __thiscall CRegister::RegisterSendCountRequest(CRegister *this,NETADDR Addr)

{
  long lVar1;
  long in_FS_OFFSET;
  CNetChunk Packet;
  undefined4 in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetServer::Send((CNetServer *)CONCAT44(in_stack_ffffffffffffffec,8),
                   (CNetChunk *)CONCAT44(2,Packet.m_Address.ip._4_4_),Packet.m_Address.ip._0_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRegister::RegisterSendCountRequest(NETADDR Addr)
{
	CNetChunk Packet;
	Packet.m_ClientID = -1;
	Packet.m_Address = Addr;
	Packet.m_Flags = NETSENDFLAG_CONNLESS;
	Packet.m_DataSize = sizeof(SERVERBROWSE_GETCOUNT);
	Packet.m_pData = SERVERBROWSE_GETCOUNT;
	m_pNetServer->Send(&Packet);
}